

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPPacketBuilder::BuildPacketEx
          (RTPPacketBuilder *this,void *data,size_t len,uint16_t hdrextID,void *hdrextdata,
          size_t numhdrextwords)

{
  size_t numhdrextwords_local;
  void *hdrextdata_local;
  uint16_t hdrextID_local;
  size_t len_local;
  void *data_local;
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x14;
  }
  else if ((this->defptset & 1U) == 0) {
    this_local._4_4_ = -0x11;
  }
  else if ((this->defmarkset & 1U) == 0) {
    this_local._4_4_ = -0x10;
  }
  else if ((this->deftsset & 1U) == 0) {
    this_local._4_4_ = -0x12;
  }
  else {
    this_local._4_4_ =
         PrivateBuildPacket(this,data,len,this->defaultpayloadtype,(bool)(this->defaultmark & 1),
                            this->defaulttimestampinc,true,hdrextID,hdrextdata,numhdrextwords);
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::BuildPacketEx(const void *data,size_t len,
                  uint16_t hdrextID,const void *hdrextdata,size_t numhdrextwords)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (!defptset)
		return ERR_RTP_PACKBUILD_DEFAULTPAYLOADTYPENOTSET;
	if (!defmarkset)
		return ERR_RTP_PACKBUILD_DEFAULTMARKNOTSET;
	if (!deftsset)
		return ERR_RTP_PACKBUILD_DEFAULTTSINCNOTSET;
	return PrivateBuildPacket(data,len,defaultpayloadtype,defaultmark,defaulttimestampinc,true,hdrextID,hdrextdata,numhdrextwords);
}